

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp.c
# Opt level: O1

void fe_warp_print(melfb_t *mel,char *label)

{
  float *pfVar1;
  ulong uVar2;
  
  switch(mel->warp_id) {
  case 0:
    printf("%s[%04u]: %6.3f ",(double)params[0],label,0);
    putchar(10);
    return;
  case 1:
    pfVar1 = params;
    uVar2 = 0;
    break;
  case 2:
    pfVar1 = params;
    uVar2 = 0;
    do {
      printf("%s[%04u]: %6.3f ",(double)*pfVar1,label,uVar2 & 0xffffffff);
      uVar2 = uVar2 + 1;
      pfVar1 = pfVar1 + 1;
    } while (uVar2 == 1);
    putchar(10);
    return;
  default:
    if (mel->warp_id == 0xffffffff) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_warp.c"
              ,0xf5,"fe_warp module must be configured w/ a valid ID\n");
    }
    else {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_warp.c"
              ,0xfa,"fe_warp module misconfigured with invalid fe_warp_id %u\n");
    }
    exit(1);
  }
  do {
    printf("%s[%04u]: %6.3f ",(double)*pfVar1,label,uVar2 & 0xffffffff);
    uVar2 = uVar2 + 1;
    pfVar1 = pfVar1 + 1;
  } while (uVar2 == 1);
  putchar(10);
  return;
}

Assistant:

void
fe_warp_print(melfb_t *mel, const char *label)
{
    if (mel->warp_id <= FE_WARP_ID_MAX) {
        fe_warp_conf[mel->warp_id].print(label);
    }
    else if (mel->warp_id == FE_WARP_ID_NONE) {
        E_FATAL("fe_warp module must be configured w/ a valid ID\n");
    }
    else {
        E_FATAL
            ("fe_warp module misconfigured with invalid fe_warp_id %u\n",
             mel->warp_id);
    }
}